

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O2

uint128 * __thiscall google::protobuf::uint128::operator*=(uint128 *this,uint128 *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint128 local_40;
  
  uVar4 = this->lo_;
  uVar1 = this->hi_;
  uVar6 = uVar4 & 0xffffffff;
  uVar2 = b->hi_;
  uVar3 = b->lo_;
  uVar5 = uVar3 & 0xffffffff;
  this->hi_ = ((ulong)(uint)((int)(uVar2 >> 0x20) * (int)uVar4 + (int)uVar1 * (int)(uVar3 >> 0x20) +
                            (int)uVar2 * (int)(uVar4 >> 0x20) + (int)(uVar1 >> 0x20) * (int)uVar3)
              << 0x20) +
              (uVar2 & 0xffffffff) * uVar6 + (uVar3 >> 0x20) * (uVar4 >> 0x20) +
              (uVar1 & 0xffffffff) * uVar5;
  this->lo_ = 0;
  uVar4 = (uVar4 >> 0x20) * uVar5;
  local_40.hi_ = uVar4 >> 0x20;
  local_40.lo_ = uVar4 << 0x20;
  operator+=(this,&local_40);
  uVar4 = (uVar3 >> 0x20) * uVar6;
  local_40.hi_ = uVar4 >> 0x20;
  local_40.lo_ = uVar4 << 0x20;
  operator+=(this,&local_40);
  local_40.lo_ = uVar5 * uVar6;
  local_40.hi_ = 0;
  operator+=(this,&local_40);
  return this;
}

Assistant:

inline uint128& uint128::operator*=(const uint128& b) {
  uint64 a96 = hi_ >> 32;
  uint64 a64 = hi_ & 0xffffffffu;
  uint64 a32 = lo_ >> 32;
  uint64 a00 = lo_ & 0xffffffffu;
  uint64 b96 = b.hi_ >> 32;
  uint64 b64 = b.hi_ & 0xffffffffu;
  uint64 b32 = b.lo_ >> 32;
  uint64 b00 = b.lo_ & 0xffffffffu;
  // multiply [a96 .. a00] x [b96 .. b00]
  // terms higher than c96 disappear off the high side
  // terms c96 and c64 are safe to ignore carry bit
  uint64 c96 = a96 * b00 + a64 * b32 + a32 * b64 + a00 * b96;
  uint64 c64 = a64 * b00 + a32 * b32 + a00 * b64;
  this->hi_ = (c96 << 32) + c64;
  this->lo_ = 0;
  // add terms after this one at a time to capture carry
  *this += uint128(a32 * b00) << 32;
  *this += uint128(a00 * b32) << 32;
  *this += a00 * b00;
  return *this;
}